

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O2

void cpu_ppc601_store_rtcu_ppc64(CPUPPCState_conflict2 *env,uint32_t value)

{
  ppc_tb_t *ppVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int64_t iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  ppVar1 = env->tb_env;
  uVar6 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar6;
  auVar2 = ZEXT416(ppVar1->tb_freq) * auVar2;
  iVar5 = __udivti3(auVar2._0_8_,auVar2._8_8_,1000000000,0);
  iVar4 = ppVar1->tb_offset;
  uVar6 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar6;
  auVar3 = ZEXT416(ppVar1->tb_freq) * auVar3;
  lVar7 = __udivti3(auVar3._0_8_,auVar3._8_8_,1000000000,0);
  ppVar1->tb_offset = CONCAT44(value,iVar5 + (int)iVar4) - lVar7;
  return;
}

Assistant:

void cpu_ppc601_store_rtcu (CPUPPCState *env, uint32_t value)
{
    _cpu_ppc_store_tbu(env, value);
}